

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int get_extra_by_id(int argc,char **argv)

{
  FILE *__stream;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulonglong uVar4;
  ulonglong uVar5;
  zip_uint8_t *data;
  undefined8 uVar6;
  zip_uint64_t idx;
  zip_uint8_t *efdata;
  ushort local_20;
  ushort local_1e;
  zip_flags_t zStack_1c;
  zip_uint16_t eflen;
  zip_uint16_t eidx;
  zip_uint16_t eid;
  zip_flags_t geflags;
  char **argv_local;
  int argc_local;
  
  _eidx = argv;
  argv_local._0_4_ = argc;
  uVar4 = strtoull(*argv,(char **)0x0,10);
  uVar5 = strtoull(_eidx[1],(char **)0x0,10);
  local_1e = (ushort)uVar5;
  uVar5 = strtoull(_eidx[2],(char **)0x0,10);
  local_20 = (ushort)uVar5;
  zStack_1c = get_flags(_eidx[3]);
  data = (zip_uint8_t *)
         zip_file_extra_field_get_by_id(za,uVar4,local_1e,local_20,(long)&efdata + 6,zStack_1c);
  uVar3 = zStack_1c;
  uVar2 = local_1e;
  uVar1 = local_20;
  __stream = _stderr;
  if (data == (zip_uint8_t *)0x0) {
    uVar6 = zip_strerror(za);
    fprintf(__stream,
            "can\'t get extra field data for file at index %lu, extra field id %d, ef index %d, flags %u: %s\n"
            ,uVar4,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3,uVar6);
    argv_local._4_4_ = -1;
  }
  else {
    printf("Extra field 0x%04x: len %d",(ulong)local_1e,(ulong)efdata._6_2_);
    if (efdata._6_2_ != 0) {
      printf(", data ");
      hexdump(data,efdata._6_2_);
    }
    printf("\n");
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
get_extra_by_id(int argc, char *argv[]) {
    zip_flags_t geflags;
    zip_uint16_t eid, eidx, eflen;
    const zip_uint8_t *efdata;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    eidx = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    geflags = get_flags(argv[3]);
    if ((efdata = zip_file_extra_field_get_by_id(za, idx, eid, eidx, &eflen, geflags)) == NULL) {
	fprintf(stderr, "can't get extra field data for file at index %" PRIu64 ", extra field id %d, ef index %d, flags %u: %s\n", idx, eid, eidx, geflags, zip_strerror(za));
	return -1;
    }
    printf("Extra field 0x%04x: len %d", eid, eflen);
    if (eflen > 0) {
	printf(", data ");
	hexdump(efdata, eflen);
    }
    printf("\n");
    return 0;
}